

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_lite.cc
# Opt level: O1

char * google::protobuf::internal::TcParser::MpString<true>
                 (MessageLite *msg,char *ptr,ParseContext *ctx,TcFieldData data,
                 TcParseTableBase *table,uint64_t hasbits)

{
  byte bVar1;
  ushort uVar2;
  bool bVar3;
  int iVar4;
  uint uVar5;
  char *pcVar6;
  TailCallParseFunc UNRECOVERED_JUMPTABLE;
  void *pvVar7;
  ushort *puVar8;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 aVar9;
  string *s;
  ulong uVar10;
  code *ctx_00;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 aVar11;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 table_00;
  ParseContext *extraout_RDX;
  ParseContext *extraout_RDX_00;
  ParseContext *extraout_RDX_01;
  ParseContext *extraout_RDX_02;
  ParseContext *ctx_01;
  ParseContext *extraout_RDX_03;
  ushort uVar12;
  uint *puVar13;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 table_01;
  Arena *pAVar14;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 cord;
  uint16_t xform_val;
  uint64_t uVar15;
  size_t size;
  string_view sVar16;
  pair<const_char_*,_int> pVar17;
  string_view wire_bytes;
  string_view wire_bytes_00;
  ushort local_44;
  
  table_00.data = (long)&table->has_bits_offset + ((ulong)data.field_0 >> 0x20);
  if ((table_00.data & 3) != 0) {
    AlignFail(table_00.data);
  }
  if ((data.field_0._0_4_ & 7) != 2) {
    UNRECOVERED_JUMPTABLE = table->fallback;
    goto LAB_0021067c;
  }
  uVar2 = *(ushort *)(table_00.data + 10);
  uVar12 = uVar2 & 0x30;
  if (uVar12 == 0x20) {
    pcVar6 = MpRepeatedString<true>(msg,ptr,ctx,data,table,hasbits);
    return pcVar6;
  }
  uVar15 = hasbits;
  if (uVar12 == 0x10) {
    uVar5 = *(uint *)(table_00.data + 4);
    ctx_00._4_4_ = 0;
    ctx_00._0_4_ = uVar5;
    puVar13 = (uint *)((long)&msg->_vptr_MessageLite + (ulong)(uVar5 >> 5) * 4);
    if (((ulong)puVar13 & 3) != 0) {
      AlignFail();
    }
    *puVar13 = *puVar13 | 1 << ((byte)uVar5 & 0x1f);
LAB_002106e4:
    bVar3 = false;
  }
  else {
    ctx_00 = (code *)data.field_0;
    if (uVar12 != 0x30) goto LAB_002106e4;
    ctx_00._0_4_ = data.field_0._0_4_ >> 3;
    ctx_00._4_4_ = 0;
    bVar3 = ChangeOneof(table,(FieldEntry *)table_00,ctx_00._0_4_,(ParseContext *)ctx_00,msg);
  }
  xform_val = (uint16_t)uVar15;
  local_44 = uVar2 & 0x600;
  table_01.data = 1;
  aVar11 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)msg;
  pvVar7 = MaybeGetSplitBase(msg,true,table);
  if ((uVar2 & 0x1c0) == 0x140) {
    cord.data = (long)pvVar7 + (ulong)*(uint *)table_00;
    if ((cord.data & 7) != 0) goto LAB_00210a31;
    if (bVar3 != false) {
      *(uint64_t *)cord = 0;
    }
    pAVar14 = (Arena *)(msg->_internal_metadata_).ptr_;
    if (((ulong)pAVar14 & 1) != 0) {
      pAVar14 = *(Arena **)((ulong)pAVar14 & 0xfffffffffffffffe);
    }
    uVar5 = (uint)(byte)*ptr;
    if (*ptr < '\0') {
      pVar17 = ReadSizeFallback(ptr,uVar5);
      pcVar6 = pVar17.first;
      uVar5 = pVar17.second;
    }
    else {
      pcVar6 = ptr + 1;
    }
    if (pcVar6 == (char *)0x0) {
      puVar8 = (ushort *)0x0;
    }
    else {
      iVar4 = EpsCopyInputStream::BytesAvailable(&ctx->super_EpsCopyInputStream,pcVar6);
      if (iVar4 < (int)uVar5) {
        puVar8 = (ushort *)
                 EpsCopyInputStream::ReadMicroStringFallback
                           (&ctx->super_EpsCopyInputStream,pcVar6,uVar5,(MicroString *)cord,pAVar14)
        ;
      }
      else {
        sVar16._M_str = pcVar6;
        sVar16._M_len = (long)(int)uVar5;
        MicroString::SetImpl((MicroString *)cord,sVar16,pAVar14,7);
        puVar8 = (ushort *)(pcVar6 + (int)uVar5);
      }
    }
    sVar16 = MicroString::Get((MicroString *)cord);
    table_01.data = (uint64_t)sVar16._M_str;
    wire_bytes_00._M_str = (char *)table;
    wire_bytes_00._M_len = table_01.data;
    bVar3 = MpVerifyUtf8((TcParser *)sVar16._M_len,wire_bytes_00,(TcParseTableBase *)table_00,
                         (FieldEntry *)(ulong)local_44,xform_val);
    ctx_01 = extraout_RDX_00;
  }
  else if ((uVar2 & 0x1c0) == 0x80) {
    if (uVar12 == 0x30) {
      if (bVar3 == false) {
        aVar11.data = (long)&msg->_vptr_MessageLite + (ulong)*(uint *)table_00;
        cord.data = aVar11.data;
        if ((aVar11.data & 7) != 0) goto LAB_00210a31;
        cord.data = *aVar11.data;
      }
      else {
        pAVar14 = (Arena *)(msg->_internal_metadata_).ptr_;
        if (((ulong)pAVar14 & 1) != 0) {
          pAVar14 = *(Arena **)((ulong)pAVar14 & 0xfffffffffffffffe);
        }
        if (pAVar14 == (Arena *)0x0) {
          aVar9 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)operator_new(0x10);
        }
        else {
          ctx_00 = cleanup::arena_destruct_object<absl::lts_20250127::Cord>;
          table_01.data = (uint64_t)&DAT_00000010;
          aVar9 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)
                  Arena::AllocateAlignedWithCleanup
                            (pAVar14,0x10,8,cleanup::arena_destruct_object<absl::lts_20250127::Cord>
                            );
        }
        *(undefined8 *)aVar9 = 0;
        *(undefined8 *)(aVar9.data + 8) = 0;
        aVar11.data = (long)&msg->_vptr_MessageLite + (ulong)*(uint *)table_00;
        cord.data = aVar11.data;
        if ((aVar11.data & 7) != 0) {
LAB_00210a31:
          AlignFail(cord.data);
        }
        *(anon_union_8_1_898a9ca8_for_TcFieldData_0 *)aVar11 = (uint64_t)aVar9;
        cord = aVar9;
      }
    }
    else {
      cord.data = (long)pvVar7 + (ulong)*(uint *)table_00;
      if ((cord.data & 7) != 0) goto LAB_00210a31;
    }
    bVar1 = *ptr;
    if ((char)bVar1 < '\0') {
      table_01.data._4_4_ = 0;
      table_01.data._0_4_ = CONCAT31(0,bVar1);
      pVar17 = ReadSizeFallback(ptr,CONCAT31(0,bVar1));
      table_00 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)ctx_00;
    }
    else {
      pVar17.second._0_1_ = bVar1;
      pVar17.first = ptr + 1;
      pVar17._9_7_ = 0;
      table_00 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)ctx_00;
      ptr = (char *)aVar11;
    }
    ctx_01 = pVar17._8_8_;
    aVar11.data = (uint64_t)pVar17.first;
    if ((anon_union_8_1_898a9ca8_for_TcFieldData_0 *)aVar11.data ==
        (anon_union_8_1_898a9ca8_for_TcFieldData_0 *)0x0) {
      puVar8 = (ushort *)0x0;
    }
    else {
      ptr = (char *)ctx;
      puVar8 = (ushort *)
               EpsCopyInputStream::ReadCord
                         (&ctx->super_EpsCopyInputStream,(char *)aVar11,pVar17.second,(Cord *)cord);
      table_00 = cord;
      ctx_01 = extraout_RDX_01;
      table_01 = aVar11;
    }
    bVar3 = puVar8 != (ushort *)0x0;
    if (bVar3) {
      table_00.data._2_6_ = 0;
      table_00.data._0_2_ = local_44;
      MpVerifyUtf8((Cord *)ptr,(TcParseTableBase *)table_01,(FieldEntry *)ctx_01,local_44);
      bVar3 = true;
      ctx_01 = extraout_RDX_02;
    }
  }
  else {
    if ((uVar2 & 0x1c0) != 0) {
      Unreachable("/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_lite.cc"
                  ,0x967);
    }
    table_01.data = (long)pvVar7 + (ulong)*(uint *)table_00;
    cord.data = table_01.data;
    if ((table_01.data & 7) != 0) goto LAB_00210a31;
    if (bVar3 != false) {
      *(undefined8 **)table_01 = &fixed_address_empty_string;
    }
    aVar11 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)(msg->_internal_metadata_).ptr_;
    if ((aVar11.data & 1) != 0) {
      aVar11 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)
               ((anon_union_8_1_898a9ca8_for_TcFieldData_0 *)(aVar11.data & 0xfffffffffffffffe))->
               data;
    }
    if (aVar11.data == 0) {
      s = ArenaStringPtr::MutableNoCopy_abi_cxx11_((ArenaStringPtr *)table_01,(Arena *)0x0);
      puVar8 = (ushort *)InlineGreedyStringParser(s,ptr,ctx);
    }
    else {
      puVar8 = (ushort *)
               EpsCopyInputStream::ReadArenaString
                         (&ctx->super_EpsCopyInputStream,ptr,(ArenaStringPtr *)table_01,
                          (Arena *)aVar11);
    }
    if (puVar8 == (ushort *)0x0) {
      anon_unknown_105::EnsureArenaStringIsNotDefault(msg,(ArenaStringPtr *)table_01);
      bVar3 = false;
      table_00 = aVar11;
      ctx_01 = extraout_RDX_03;
    }
    else {
      uVar10 = *(ulong *)table_01;
      table_01 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)
                 ((anon_union_8_1_898a9ca8_for_TcFieldData_0 *)(uVar10 & 0xfffffffffffffffc))->data;
      wire_bytes._M_str = (char *)table;
      wire_bytes._M_len = table_01.data;
      bVar3 = MpVerifyUtf8((TcParser *)
                           ((anon_union_8_1_898a9ca8_for_TcFieldData_0 *)
                           (uVar10 & 0xfffffffffffffffc))[1],wire_bytes,(TcParseTableBase *)table_00
                           ,(FieldEntry *)(ulong)local_44,xform_val);
      ctx_01 = extraout_RDX;
    }
  }
  ptr = (char *)puVar8;
  if ((bVar3 == false) || ((ushort *)ptr == (ushort *)0x0)) {
    pcVar6 = Error(msg,(char *)table_01,ctx_01,(TcFieldData)table_00,table,hasbits);
    return pcVar6;
  }
  if ((ctx->super_EpsCopyInputStream).limit_end_ <= ptr) {
    if ((ulong)table->has_bits_offset != 0) {
      puVar13 = (uint *)((long)&msg->_vptr_MessageLite + (ulong)table->has_bits_offset);
      if (((ulong)puVar13 & 3) != 0) {
        AlignFail(puVar13);
      }
      *puVar13 = *puVar13 | (uint)hasbits;
    }
    return (char *)(ushort *)ptr;
  }
  uVar5 = (uint)table->fast_idx_mask & (uint)*(ushort *)ptr;
  if ((uVar5 & 7) != 0) {
    protobuf_assumption_failed
              ("(idx & 7) == 0",
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_impl.h"
               ,0x452);
  }
  uVar10 = (ulong)(uVar5 & 0xfffffff8);
  data.field_0 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)
                 ((ulong)*(ushort *)ptr ^ *(ulong *)(&table[1].fast_idx_mask + uVar10 * 2));
  UNRECOVERED_JUMPTABLE = *(TailCallParseFunc *)(&table[1].has_bits_offset + uVar10);
LAB_0021067c:
  pcVar6 = (*UNRECOVERED_JUMPTABLE)(msg,ptr,ctx,data,table,hasbits);
  return pcVar6;
}

Assistant:

PROTOBUF_NOINLINE const char* TcParser::MpString(PROTOBUF_TC_PARAM_DECL) {
  const auto& entry = RefAt<FieldEntry>(table, data.entry_offset());
  const uint16_t type_card = entry.type_card;
  const uint16_t card = type_card & field_layout::kFcMask;
  const uint32_t decoded_wiretype = data.tag() & 7;

  if (decoded_wiretype != WireFormatLite::WIRETYPE_LENGTH_DELIMITED) {
    PROTOBUF_MUSTTAIL return table->fallback(PROTOBUF_TC_PARAM_PASS);
  }
  if (card == field_layout::kFcRepeated) {
    PROTOBUF_MUSTTAIL return MpRepeatedString<is_split>(PROTOBUF_TC_PARAM_PASS);
  }
  const uint16_t xform_val = type_card & field_layout::kTvMask;
  const uint16_t rep = type_card & field_layout::kRepMask;

  // Mark the field as present:
  const bool is_oneof = card == field_layout::kFcOneof;
  bool need_init = false;
  if (card == field_layout::kFcOptional) {
    SetHas(entry, msg);
  } else if (is_oneof) {
    need_init = ChangeOneof(table, entry, data.tag() >> 3, ctx, msg);
  }

  bool is_valid = false;
  void* const base = MaybeGetSplitBase(msg, is_split, table);
  switch (rep) {
    case field_layout::kRepAString: {
      auto& field = RefAt<ArenaStringPtr>(base, entry.offset);
      if (need_init) field.InitDefault();
      Arena* arena = msg->GetArena();
      if (arena) {
        ptr = ctx->ReadArenaString(ptr, &field, arena);
      } else {
        std::string* str = field.MutableNoCopy(nullptr);
        ptr = InlineGreedyStringParser(str, ptr, ctx);
      }
      if (ABSL_PREDICT_FALSE(ptr == nullptr)) {
        EnsureArenaStringIsNotDefault(msg, &field);
        break;
      }
      is_valid = MpVerifyUtf8(field.Get(), table, entry, xform_val);
      break;
    }

    case field_layout::kRepMString: {
      auto& field = RefAt<MicroString>(base, entry.offset);
      if (need_init) field.InitDefault();
      ptr = ctx->ReadMicroString(ptr, field, msg->GetArena());
      is_valid = MpVerifyUtf8(field.Get(), table, entry, xform_val);
      break;
    }


    case field_layout::kRepCord: {
      absl::Cord* field;
      if (is_oneof) {
        if (need_init) {
          field = Arena::Create<absl::Cord>(msg->GetArena());
          RefAt<absl::Cord*>(msg, entry.offset) = field;
        } else {
          field = RefAt<absl::Cord*>(msg, entry.offset);
        }
      } else {
        field = &RefAt<absl::Cord>(base, entry.offset);
      }
      ptr = InlineCordParser(field, ptr, ctx);
      if (!ptr) break;
      is_valid = MpVerifyUtf8(*field, table, entry, xform_val);
      break;
    }

    default:
      Unreachable();
  }

  if (ABSL_PREDICT_FALSE(ptr == nullptr || !is_valid)) {
    PROTOBUF_MUSTTAIL return Error(PROTOBUF_TC_PARAM_NO_DATA_PASS);
  }
  PROTOBUF_MUSTTAIL return ToTagDispatch(PROTOBUF_TC_PARAM_NO_DATA_PASS);
}